

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.cpp
# Opt level: O2

void __thiscall embree::GridMesh::setNumTimeSteps(GridMesh *this,uint numTimeSteps)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  Device *pDVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  undefined4 extraout_var;
  size_t i;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar14 = (ulong)numTimeSteps;
  uVar16 = (this->vertices).size_alloced;
  uVar15 = uVar16;
  if ((uVar16 < uVar14) && (uVar12 = uVar16, uVar15 = uVar14, uVar16 != 0)) {
    for (; uVar15 = uVar12, uVar12 < uVar14; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
    }
  }
  uVar12 = (this->vertices).size_active;
  if (uVar14 < uVar12) {
    lVar13 = uVar14 * 0x38;
    for (uVar16 = uVar14; uVar16 < uVar12; uVar16 = uVar16 + 1) {
      RawBufferView::~RawBufferView
                ((RawBufferView *)
                 ((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar13));
      uVar12 = (this->vertices).size_active;
      lVar13 = lVar13 + 0x38;
    }
    (this->vertices).size_active = uVar14;
    uVar16 = (this->vertices).size_alloced;
    uVar12 = uVar14;
  }
  if (uVar16 == uVar15) {
    lVar13 = uVar12 * 0x38 + 0x30;
    for (; uVar12 < uVar14; uVar12 = uVar12 + 1) {
      pBVar3 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar13 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar13 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar3 + lVar13 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar3 + lVar13 + -8) = 1;
      *(undefined4 *)((long)pBVar3 + lVar13 + -4) = 0;
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar13) = 0;
      lVar13 = lVar13 + 0x38;
    }
    (this->vertices).size_active = uVar14;
  }
  else {
    pDVar4 = (this->vertices).alloc.device;
    pBVar3 = (this->vertices).items;
    iVar11 = (*(pDVar4->super_State).super_RefCount._vptr_RefCount[8])(pDVar4,uVar15 * 0x38,8,3);
    (this->vertices).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var,iVar11);
    lVar13 = 0;
    for (uVar16 = 0; uVar12 = (this->vertices).size_active, uVar16 < uVar12; uVar16 = uVar16 + 1) {
      pBVar5 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar13);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).stride + lVar13);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).format + lVar13);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).format + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).stride + lVar13);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar13);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      *(undefined8 *)((long)&(pBVar5->super_RawBufferView).buffer.ptr + lVar13) =
           *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar13);
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar13) = 0;
      RawBufferView::~RawBufferView
                ((RawBufferView *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar13));
      lVar13 = lVar13 + 0x38;
    }
    lVar13 = uVar12 * 0x38 + 0x30;
    for (; uVar12 < uVar14; uVar12 = uVar12 + 1) {
      pBVar5 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)pBVar5 + lVar13 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar5 + lVar13 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar5 + lVar13 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar5 + lVar13 + -8) = 1;
      *(undefined4 *)((long)pBVar5 + lVar13 + -4) = 0;
      *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar13) = 0;
      lVar13 = lVar13 + 0x38;
    }
    pDVar4 = (this->vertices).alloc.device;
    if (pDVar4 != (Device *)0x0) {
      (*(pDVar4->super_State).super_RefCount._vptr_RefCount[9])(pDVar4,pBVar3);
    }
    (this->vertices).size_active = uVar14;
    (this->vertices).size_alloced = uVar15;
  }
  Geometry::setNumTimeSteps(&this->super_Geometry,numTimeSteps);
  return;
}

Assistant:

void GridMesh::setNumTimeSteps (unsigned int numTimeSteps)
  {
    vertices.resize(numTimeSteps);
    Geometry::setNumTimeSteps(numTimeSteps);
  }